

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderAlgorithmTests.cpp
# Opt level: O2

ShaderAlgorithmCase *
deqp::gles2::Functional::createExpressionCase
          (Context *context,char *caseName,char *description,bool isVertexCase,
          ShaderEvalFunc evalFunc,LineStream *shaderBody)

{
  ShaderAlgorithmCase *this;
  ostringstream *poVar1;
  char *pcVar2;
  ostringstream *poVar3;
  allocator<char> local_409;
  string vertexShaderSource;
  string fragmentShaderSource;
  StringTemplate fragTemplate;
  StringTemplate vertTemplate;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream vtx;
  ostringstream frag;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar1 = (ostringstream *)&frag;
  if (isVertexCase) {
    poVar1 = (ostringstream *)&vtx;
  }
  std::operator<<((ostream *)&vtx,"attribute highp vec4 a_position;\n");
  std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                  "attribute highp vec4 a_unitCoords;\n");
  if (isVertexCase) {
    pcVar2 = "varying mediump vec3 v_color;\n";
    std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                    "varying mediump vec3 v_color;\n");
  }
  else {
    pcVar2 = "varying mediump vec4 v_coords;\n";
    std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                    "varying mediump vec4 v_coords;\n");
  }
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
  std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
  std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
  std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                  "\tgl_Position = a_position;\n");
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
  poVar3 = &frag;
  if (isVertexCase) {
    poVar3 = &vtx;
  }
  pcVar2 = "\t${PRECISION} vec4 coords = v_coords;\n";
  if (isVertexCase) {
    pcVar2 = "\t${PRECISION} vec4 coords = a_unitCoords;\n";
  }
  std::operator<<(&poVar3->super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
  std::operator<<((ostream *)poVar1,"\t${PRECISION} vec3 res = vec3(0.0);\n");
  pcVar2 = deqp::gls::LineStream::str(shaderBody);
  std::operator<<((ostream *)poVar1,pcVar2);
  if (isVertexCase) {
    std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\tv_color = res;\n");
    pcVar2 = "\tgl_FragColor = vec4(v_color, 1.0);\n";
  }
  else {
    std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                    "\tv_coords = a_unitCoords;\n");
    pcVar2 = "\tgl_FragColor = vec4(res, 1.0);\n";
  }
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
  std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&vertTemplate,(char (*) [10])0x190088b,(char (*) [8])0x180ebcd);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&params,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&vertTemplate);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&vertTemplate);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragTemplate,vertexShaderSource._M_dataplus._M_p,
             (allocator<char> *)&fragmentShaderSource);
  tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
  std::__cxx11::string::~string((string *)&fragTemplate);
  std::__cxx11::string::~string((string *)&vertexShaderSource);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexShaderSource,fragmentShaderSource._M_dataplus._M_p,&local_409);
  tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
  std::__cxx11::string::~string((string *)&vertexShaderSource);
  std::__cxx11::string::~string((string *)&fragmentShaderSource);
  tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
  tcu::StringTemplate::specialize(&fragmentShaderSource,&fragTemplate,&params);
  this = (ShaderAlgorithmCase *)operator_new(0x128);
  ShaderAlgorithmCase::ShaderAlgorithmCase
            (this,context,caseName,description,isVertexCase,evalFunc,
             vertexShaderSource._M_dataplus._M_p,fragmentShaderSource._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&fragmentShaderSource);
  std::__cxx11::string::~string((string *)&vertexShaderSource);
  tcu::StringTemplate::~StringTemplate(&fragTemplate);
  tcu::StringTemplate::~StringTemplate(&vertTemplate);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&params._M_t);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
  return this;
}

Assistant:

static ShaderAlgorithmCase* createExpressionCase (Context& context, const char* caseName, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, LineStream& shaderBody)
{
	std::ostringstream vtx;
	std::ostringstream frag;
	std::ostringstream& op = isVertexCase ? vtx : frag;

	vtx << "attribute highp vec4 a_position;\n";
	vtx << "attribute highp vec4 a_unitCoords;\n";

	if (isVertexCase)
	{
		vtx << "varying mediump vec3 v_color;\n";
		frag << "varying mediump vec3 v_color;\n";
	}
	else
	{
		vtx << "varying mediump vec4 v_coords;\n";
		frag << "varying mediump vec4 v_coords;\n";
	}

//	op << "uniform mediump sampler2D ut_brick;\n";

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Write matrix.
	if (isVertexCase)
		op << "	${PRECISION} vec4 coords = a_unitCoords;\n";
	else
		op << "	${PRECISION} vec4 coords = v_coords;\n";

	op << "	${PRECISION} vec3 res = vec3(0.0);\n";
	op << shaderBody.str();

	if (isVertexCase)
	{
		vtx << "	v_color = res;\n";
		frag << "	gl_FragColor = vec4(v_color, 1.0);\n";
	}
	else
	{
		vtx << "	v_coords = a_unitCoords;\n";
		frag << "	gl_FragColor = vec4(res, 1.0);\n";
	}

	vtx << "}\n";
	frag << "}\n";

	// Fill in shader templates.
	map<string, string> params;
	params.insert(pair<string, string>("PRECISION", "mediump"));

	StringTemplate vertTemplate(vtx.str().c_str());
	StringTemplate fragTemplate(frag.str().c_str());
	string vertexShaderSource = vertTemplate.specialize(params);
	string fragmentShaderSource = fragTemplate.specialize(params);

	return new ShaderAlgorithmCase(context, caseName, description, isVertexCase, evalFunc, vertexShaderSource.c_str(), fragmentShaderSource.c_str());
}